

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::EnumDescriptorProto::EnumDescriptorProto(EnumDescriptorProto *this)

{
  EnumDescriptorProto *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__EnumDescriptorProto_009c0af0
  ;
  ::std::__cxx11::string::string((string *)&this->name_);
  std::
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  ::vector(&this->value_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reserved_name_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<6UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto() = default;